

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O2

Stream * rw::d3d8::readNativeData
                   (Stream *stream,int32 param_2,void *object,int32 param_4,int32 param_5)

{
  ushort uVar1;
  bool bVar2;
  uint32 uVar3;
  uint uVar4;
  undefined4 *puVar5;
  undefined2 *puVar6;
  undefined4 *puVar7;
  void *pvVar8;
  uint16 *puVar9;
  uint8 *puVar10;
  char *pcVar11;
  long lVar12;
  int *piVar13;
  FILE *__stream;
  Error _e;
  
  bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar2) {
    uVar3 = Stream::readU32(stream);
    if (uVar3 == 8) {
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d8.cpp line: 116"
      ;
      puVar5 = (undefined4 *)(*DAT_00145dd8)(0x10,0x3000f);
      *(undefined4 **)((long)object + 0x98) = puVar5;
      *puVar5 = 8;
      uVar4 = Stream::readI32(stream);
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d8.cpp line: 121"
      ;
      puVar6 = (undefined2 *)(*DAT_00145dd8)((long)(int)uVar4,0x1000f);
      (*stream->_vptr_Stream[4])(stream,puVar6,(ulong)uVar4);
      *(undefined2 *)(puVar5 + 1) = *puVar6;
      uVar1 = puVar6[1];
      *(ushort *)((long)puVar5 + 6) = uVar1;
      allocLocation =
           "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d8.cpp line: 126"
      ;
      puVar7 = (undefined4 *)(*DAT_00145dd8)((ulong)uVar1 * 0x38);
      *(undefined4 **)(puVar5 + 2) = puVar7;
      uVar1 = *(ushort *)((long)puVar5 + 6);
      for (lVar12 = 0; (uint)uVar1 * 0x2b != (int)lVar12; lVar12 = lVar12 + 0x2b) {
        *puVar7 = *(undefined4 *)((long)puVar6 + lVar12 + 4);
        puVar7[1] = *(undefined4 *)((long)puVar6 + lVar12 + 8);
        puVar7[2] = *(undefined4 *)((long)puVar6 + lVar12 + 0xc);
        puVar7[3] = *(undefined4 *)((long)puVar6 + lVar12 + 0x10);
        *(undefined8 *)(puVar7 + 4) =
             *(undefined8 *)
              (*(long *)((long)object + 0x80) + (ulong)*(uint *)((long)puVar6 + lVar12 + 0x14) * 8);
        puVar7[6] = *(undefined4 *)((long)puVar6 + lVar12 + 0x18);
        puVar7[7] = *(undefined4 *)((long)puVar6 + lVar12 + 0x1c);
        *(undefined8 *)(puVar7 + 8) = 0;
        *(undefined8 *)(puVar7 + 10) = 0;
        puVar7[0xc] = 0;
        *(undefined1 *)(puVar7 + 0xd) = *(undefined1 *)((long)puVar6 + lVar12 + 0x2c);
        *(undefined2 *)((long)puVar7 + 0x35) = 0;
        puVar7 = puVar7 + 0xe;
      }
      (*DAT_00145dd0)(puVar6);
      piVar13 = (int *)(*(long *)(puVar5 + 2) + 4);
      for (uVar4 = 0; uVar4 < *(ushort *)((long)puVar5 + 6); uVar4 = uVar4 + 1) {
        pvVar8 = d3d::createIndexBuffer(piVar13[2] * 2,false);
        *(void **)(piVar13 + 7) = pvVar8;
        puVar9 = d3d::lockIndices(pvVar8,0,0,0);
        (*stream->_vptr_Stream[4])(stream,puVar9,(ulong)(uint)(piVar13[2] * 2));
        d3d::unlockIndices(*(void **)(piVar13 + 7));
        *(undefined1 *)((long)piVar13 + 0x31) = 1;
        pvVar8 = d3d::createVertexBuffer(piVar13[1] * *piVar13,0,false);
        *(void **)(piVar13 + 9) = pvVar8;
        puVar10 = d3d::lockVertices(pvVar8,0,0,0);
        (*stream->_vptr_Stream[4])(stream,puVar10,(ulong)(uint)(piVar13[1] * *piVar13));
        d3d::unlockVertices(*(void **)(piVar13 + 9));
        piVar13 = piVar13 + 0xe;
      }
      return stream;
    }
    _e.plugin = 2;
    _e.code = 0x80000006;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d8.cpp"
            ,0x71);
    __stream = _stderr;
    pcVar11 = dbgsprint(0x80000006,(ulong)uVar3);
  }
  else {
    _e.plugin = 2;
    _e.code = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d8.cpp"
            ,0x6c);
    __stream = _stderr;
    pcVar11 = dbgsprint(0x80000004,"STRUCT");
  }
  fprintf(__stream,"%s\n",pcVar11);
  setError(&_e);
  return (Stream *)0x0;
}

Assistant:

Stream*
readNativeData(Stream *stream, int32, void *object, int32, int32)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	uint32 platform;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	platform = stream->readU32();
	if(platform != PLATFORM_D3D8){
		RWERROR((ERR_PLATFORM, platform));
		return nil;
	}
	InstanceDataHeader *header = rwNewT(InstanceDataHeader, 1, MEMDUR_EVENT | ID_GEOMETRY);
	geometry->instData = header;
	header->platform = PLATFORM_D3D8;

	int32 size = stream->readI32();
	uint8 *data = rwNewT(uint8, size, MEMDUR_FUNCTION | ID_GEOMETRY);
	stream->read8(data, size);
	uint8 *p = data;
	header->serialNumber = *(uint16*)p; p += 2;
	header->numMeshes = *(uint16*)p; p += 2;
	header->inst = rwNewT(InstanceData, header->numMeshes, MEMDUR_EVENT | ID_GEOMETRY);

	InstanceData *inst = header->inst;
	for(uint32 i = 0; i < header->numMeshes; i++){
		inst->minVert = *(uint32*)p; p += 4;
		inst->stride = *(uint32*)p; p += 4;
		inst->numVertices = *(uint32*)p; p += 4;
		inst->numIndices = *(uint32*)p; p += 4;
		uint32 matid = *(uint32*)p; p += 4;
		inst->material = geometry->matList.materials[matid];
		inst->vertexShader = *(uint32*)p; p += 4;
		inst->primType = *(uint32*)p; p += 4;
		inst->indexBuffer = nil; p += 4;
		inst->vertexBuffer = nil; p += 4;
		inst->baseIndex = 0; p += 4;
		inst->vertexAlpha = *p++;
		inst->managed = 0; p++;
		inst->remapped = 0; p++;	// TODO: really unused? and what's that anyway?
		inst++;
	}
	rwFree(data);

	inst = header->inst;
	for(uint32 i = 0; i < header->numMeshes; i++){
		assert(inst->indexBuffer == nil);
		inst->indexBuffer = createIndexBuffer(inst->numIndices*2, false);
		uint16 *indices = lockIndices(inst->indexBuffer, 0, 0, 0);
		stream->read8(indices, 2*inst->numIndices);
		unlockIndices(inst->indexBuffer);

		inst->managed = 1;
		assert(inst->vertexBuffer == nil);
		inst->vertexBuffer = createVertexBuffer(inst->stride*inst->numVertices, 0, false);
		uint8 *verts = lockVertices(inst->vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);
		stream->read8(verts, inst->stride*inst->numVertices);
		unlockVertices(inst->vertexBuffer);

		inst++;
	}
	return stream;
}